

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void AddDrawListToDrawData(ImVector<ImDrawList_*> *out_list,ImDrawList *draw_list)

{
  int *piVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  ImDrawList **ppIVar4;
  int iVar5;
  ulong uVar6;
  ImDrawList **__dest;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  uVar2 = (draw_list->CmdBuffer).Size;
  uVar6 = (ulong)uVar2;
  if (uVar6 != 0) {
    if ((int)uVar2 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                    ,0x50d,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar3 = (draw_list->CmdBuffer).Data;
    if (((pIVar3[uVar6 - 1].ElemCount != 0) ||
        (pIVar3[uVar6 - 1].UserCallback != (ImDrawCallback)0x0)) ||
       ((draw_list->CmdBuffer).Size = uVar2 - 1, uVar2 - 1 != 0)) {
      uVar2 = (draw_list->VtxBuffer).Size;
      if (((long)(int)uVar2 != 0) &&
         (draw_list->_VtxWritePtr != (draw_list->VtxBuffer).Data + (int)uVar2)) {
        __assert_fail("draw_list->VtxBuffer.Size == 0 || draw_list->_VtxWritePtr == draw_list->VtxBuffer.Data + draw_list->VtxBuffer.Size"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0xf82,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
      }
      lVar9 = (long)(draw_list->IdxBuffer).Size;
      if ((lVar9 != 0) && (draw_list->_IdxWritePtr != (draw_list->IdxBuffer).Data + lVar9)) {
        __assert_fail("draw_list->IdxBuffer.Size == 0 || draw_list->_IdxWritePtr == draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0xf83,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
      }
      uVar7 = draw_list->_VtxCurrentIdx;
      if (((draw_list->Flags & 4) == 0) && (uVar7 = uVar2, draw_list->_VtxCurrentIdx != uVar2)) {
        __assert_fail("(int)draw_list->_VtxCurrentIdx == draw_list->VtxBuffer.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0xf85,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
      }
      if (0xffff < uVar7) {
        __assert_fail("draw_list->_VtxCurrentIdx < (1 << 16) && \"Too many vertices in ImDrawList using 16-bit indices. Read comment above\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0xf97,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
      }
      iVar5 = out_list->Size;
      if (iVar5 == out_list->Capacity) {
        if (iVar5 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar5 / 2 + iVar5;
        }
        iVar10 = iVar5 + 1;
        if (iVar5 + 1 < iVar8) {
          iVar10 = iVar8;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImDrawList **)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
        if (out_list->Data != (ImDrawList **)0x0) {
          memcpy(__dest,out_list->Data,(long)out_list->Size << 3);
          ppIVar4 = out_list->Data;
          if ((ppIVar4 != (ImDrawList **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
        }
        out_list->Data = __dest;
        out_list->Capacity = iVar10;
        iVar5 = out_list->Size;
      }
      else {
        __dest = out_list->Data;
      }
      __dest[iVar5] = draw_list;
      out_list->Size = out_list->Size + 1;
    }
  }
  return;
}

Assistant:

const char* ImStrchrRange(const char* str, const char* str_end, char c)
{
    const char* p = (const char*)memchr(str, (int)c, str_end - str);
    return p;
}